

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O0

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  args_t *in_RDI;
  char *arg;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_1c;
  
  in_RDI->input_master = (FILE *)0x0;
  in_RDI->input_add = _stdin;
  in_RDI->output = _stdout;
  in_RDI->op = add;
  in_RDI->checks = id;
  in_RDI->quiet = false;
  for (local_1c = 1; local_1c < in_ESI; local_1c = local_1c + 1) {
    pcVar1 = *(char **)(in_RDX + (long)local_1c * 8);
    if ((*pcVar1 == '-') && (pcVar1[1] == '-')) {
      iVar2 = strcmp(pcVar1 + 2,"help");
      if (iVar2 == 0) {
        help();
      }
      else {
        ERROR("unknown argument: %s",pcVar1);
      }
    }
    else if (*pcVar1 == '-') {
      iVar2 = strcmp(pcVar1 + 1,"h");
      if (iVar2 == 0) {
        help();
      }
      else if (pcVar1[1] == 'o') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x111a64);
        parse_output(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'm') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x111a97);
        parse_input_master(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 'p') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x111aca);
        parse_file_operation
                  (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (pcVar1[1] == 't') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x111afa);
        parse_match_mode(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
      }
      else if (pcVar1[1] == 'q') {
        parse_quiet(in_RDI);
      }
      else {
        ERROR("unknown argument: %s",pcVar1);
      }
    }
    else if (local_1c == in_ESI + -1) {
      parse_input_add(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      ERROR("unknown argument: %s",pcVar1);
    }
  }
  if (in_RDI->input_master == (FILE *)0x0) {
    ERROR("Required argument MASTER FILE was not provided");
  }
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input_master (NULL),
    input_add( stdin ),
    output( stdout ),
    op ( DEFAULT_OPERATION ),
    checks ( DEFAULT_MATCH ),
    quiet (false)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_input_master( next_arg (i, argc, argv) );
                else if (  arg[1] == 'p')  parse_file_operation ( next_arg (i, argc, argv) );
                else if (  arg[1] == 't')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'q')  parse_quiet ( );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input_add (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
        
        if (input_master == NULL) {
            ERROR ("Required argument MASTER FILE was not provided");
        }
    }